

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filteredbrk.cpp
# Opt level: O3

int32_t __thiscall
icu_63::SimpleFilteredSentenceBreakIterator::internalPrev
          (SimpleFilteredSentenceBreakIterator *this,int32_t n)

{
  uint in_EAX;
  EFBMatchResult EVar1;
  int32_t iVar2;
  UErrorCode status;
  undefined8 uStack_28;
  
  iVar2 = n;
  if ((1 < n + 1U) &&
     ((this->fData->fBackwardsTrie).super_LocalPointerBase<icu_63::UCharsTrie>.ptr !=
      (UCharsTrie *)0x0)) {
    uStack_28 = (ulong)in_EAX;
    resetState(this,(UErrorCode *)((long)&uStack_28 + 4));
    iVar2 = -1;
    if (uStack_28._4_4_ < 1) {
      do {
        EVar1 = breakExceptionAt(this,n);
        if (EVar1 == kNoExceptionHere) {
          return n;
        }
        iVar2 = (*(((this->fDelegate).super_LocalPointerBase<icu_63::BreakIterator>.ptr)->
                  super_UObject)._vptr_UObject[0xc])();
        n = iVar2;
      } while (iVar2 - 1U < 0xfffffffe);
    }
  }
  return iVar2;
}

Assistant:

int32_t
SimpleFilteredSentenceBreakIterator::internalPrev(int32_t n) {
  if(n == 0 || n == UBRK_DONE || // at end  or
    fData->fBackwardsTrie.isNull()) { // .. no backwards table loaded == no exceptions
      return n;
  }
  // OK, do we need to break here?
  UErrorCode status = U_ZERO_ERROR;
  // refresh text
  resetState(status);
  if(U_FAILURE(status)) return UBRK_DONE; // bail out

  //if(debug2) u_printf("str, native len=%d\n", utext_nativeLength(fText.getAlias()));
  while (n != UBRK_DONE && n != 0) { // outer loop runs once per underlying break (from fDelegate).
    SimpleFilteredSentenceBreakIterator::EFBMatchResult m = breakExceptionAt(n);

    switch(m) {
    case kExceptionHere:
      n = fDelegate->previous(); // skip this one. Find the next lowerlevel break.
      continue;

    default:
    case kNoExceptionHere:
      return n;
    }    
  }
  return n;
}